

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,CallInst *call,bool decl)

{
  bool bVar1;
  TypeID TVar2;
  uint uVar3;
  uint uVar4;
  Type *this_00;
  Function *this_01;
  String *ts_2;
  Value *value;
  pointer ts;
  pointer pvVar5;
  uint64_t local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
  local_40;
  const_iterator itr;
  Type *pTStack_30;
  uint i;
  uint64_t local_28;
  undefined1 local_19;
  CallInst *pCStack_18;
  bool decl_local;
  CallInst *call_local;
  StreamState *this_local;
  
  local_19 = decl;
  pCStack_18 = call;
  call_local = (CallInst *)this;
  if (decl) {
    this_00 = Value::getType((Value *)call);
    TVar2 = Type::getTypeID(this_00);
    if (TVar2 != VoidTyID) {
      local_28 = Value::get_tween_id((Value *)pCStack_18);
      append<char_const(&)[2],unsigned_long,char_const(&)[4]>
                (this,(char (*) [2])0x2a90be,&local_28,(char (*) [4])" = ");
    }
    pTStack_30 = Value::getType((Value *)pCStack_18);
    this_01 = CallInst::getCalledFunction(pCStack_18);
    ts_2 = Function::getName_abi_cxx11_(this_01);
    append<char_const(&)[6],LLVMBC::Type*,char_const(&)[3],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2]>
              (this,(char (*) [6])"call ",&stack0xffffffffffffffd0,(char (*) [3])" @",ts_2,
               (char (*) [2])0x2a8f67);
    for (itr.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
         ._M_cur._4_4_ = 0;
        uVar4 = itr.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
                ._M_cur._4_4_, uVar3 = Instruction::getNumOperands(&pCStack_18->super_Instruction),
        uVar4 < uVar3;
        itr.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
        ._M_cur._4_4_ =
             itr.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
             ._M_cur._4_4_ + 1) {
      value = Instruction::getOperand
                        (&pCStack_18->super_Instruction,
                         itr.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
                         ._M_cur._4_4_);
      append(this,value,false);
      uVar4 = itr.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
              ._M_cur._4_4_ + 1;
      uVar3 = Instruction::getNumOperands(&pCStack_18->super_Instruction);
      if (uVar4 < uVar3) {
        append(this,", ");
      }
    }
    append(this,")");
    local_40._M_cur =
         (__node_type *)Instruction::metadata_begin_abi_cxx11_(&pCStack_18->super_Instruction);
    while( true ) {
      local_48._M_cur =
           (__node_type *)Instruction::metadata_end_abi_cxx11_(&pCStack_18->super_Instruction);
      bVar1 = std::__detail::operator!=(&local_40,&local_48);
      if (!bVar1) break;
      ts = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_false,_true>
                         *)&local_40);
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_false,_true>
                             *)&local_40);
      append<char_const(&)[3],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2],LLVMBC::MDNode*const&>
                (this,(char (*) [3])" !",&ts->first,(char (*) [2])0x2a8f72,&pvVar5->second);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_false,_true>
                    *)&local_40);
    }
  }
  else {
    local_50 = Value::get_tween_id((Value *)call);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a90be,&local_50);
  }
  return;
}

Assistant:

void StreamState::append(CallInst *call, bool decl)
{
	if (decl)
	{
		if (call->getType()->getTypeID() != Type::TypeID::VoidTyID)
			append("%", call->get_tween_id(), " = ");
		append("call ", call->getType(), " @", call->getCalledFunction()->getName(), "(");
		for (unsigned i = 0; i < call->getNumOperands(); i++)
		{
			append(call->getOperand(i));
			if (i + 1 < call->getNumOperands())
				append(", ");
		}
		append(")");

		for (auto itr = call->metadata_begin(); itr != call->metadata_end(); ++itr)
		{
			append(" !", itr->first, " ", itr->second);
		}
	}
	else
	{
		append("%", call->get_tween_id());
	}
}